

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ushort smf::MidiFile::readLittleEndian2Bytes(istream *input)

{
  ushort uVar1;
  uchar buffer [2];
  ushort local_a;
  
  local_a = 0;
  std::istream::read((char *)input,(long)&local_a);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    uVar1 = local_a << 8 | local_a >> 8;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: unexpected end of file.",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

ushort MidiFile::readLittleEndian2Bytes(std::istream& input) {
	uchar buffer[2] = {0};
	input.read((char*)buffer, 2);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	}
	return buffer[1] | (buffer[0] << 8);
}